

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTree::
climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
          (QGraphicsSceneBspTree *this,anon_class_8_1_898d2811 *visitor,QRectF *rect,int index)

{
  bool bVar1;
  const_reference pNVar2;
  int in_ECX;
  QRectF *in_RDX;
  QGraphicsSceneBspTree *in_RSI;
  QGraphicsSceneBspTree *in_RDI;
  qreal qVar3;
  int childIndex;
  Node *node;
  qsizetype in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Type TVar4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = QList<QGraphicsSceneBspTree::Node>::isEmpty
                    ((QList<QGraphicsSceneBspTree::Node> *)0xa19746);
  if (!bVar1) {
    pNVar2 = QList<QGraphicsSceneBspTree::Node>::at
                       ((QList<QGraphicsSceneBspTree::Node> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    firstChildIndex(in_RDI,in_ECX);
    TVar4 = pNVar2->type;
    if (TVar4 == Horizontal) {
      qVar3 = QRectF::top(in_RDX);
      iVar5 = (int)((ulong)pNVar2 >> 0x20);
      if ((pNVar2->field_0).offset <= qVar3) {
        climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
                  (in_RSI,(anon_class_8_1_898d2811 *)in_RDX,
                   (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),iVar5);
      }
      else {
        climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
                  (in_RSI,(anon_class_8_1_898d2811 *)in_RDX,
                   (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),iVar5);
        qVar3 = QRectF::bottom(in_RDX);
        if ((pNVar2->field_0).offset <= qVar3) {
          climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
                    (in_RSI,(anon_class_8_1_898d2811 *)in_RDX,
                     (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (int)((ulong)pNVar2 >> 0x20));
        }
      }
    }
    else if (TVar4 == Vertical) {
      qVar3 = QRectF::left(in_RDX);
      iVar5 = (int)((ulong)pNVar2 >> 0x20);
      if ((pNVar2->field_0).offset <= qVar3) {
        climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
                  (in_RSI,(anon_class_8_1_898d2811 *)in_RDX,
                   (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),iVar5);
      }
      else {
        climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
                  (in_RSI,(anon_class_8_1_898d2811 *)in_RDX,
                   (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),iVar5);
        qVar3 = QRectF::right(in_RDX);
        if ((pNVar2->field_0).offset <= qVar3) {
          climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
                    (in_RSI,(anon_class_8_1_898d2811 *)in_RDX,
                     (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (int)((ulong)pNVar2 >> 0x20));
        }
      }
    }
    else if (TVar4 == Leaf) {
      QList<QList<QGraphicsItem_*>_>::operator[]
                ((QList<QList<QGraphicsItem_*>_> *)CONCAT44(2,in_stack_ffffffffffffffc0),
                 (qsizetype)in_RSI);
      removeItem::anon_class_8_1_898d2811::operator()
                ((anon_class_8_1_898d2811 *)CONCAT44(TVar4,in_stack_ffffffffffffffc0),
                 (QList<QGraphicsItem_*> *)in_RSI);
    }
  }
  return;
}

Assistant:

void QGraphicsSceneBspTree::climbTree(Visitor &&visitor, const QRectF &rect, int index) const
{
    if (nodes.isEmpty())
        return;

    const Node &node = nodes.at(index);
    const int childIndex = firstChildIndex(index);

    switch (node.type) {
    case Node::Leaf: {
        visitor(const_cast<QList<QGraphicsItem*>*>(&leaves[node.leafIndex]));
        break;
    }
    case Node::Vertical:
        if (rect.left() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.right() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
        break;
    case Node::Horizontal:
        if (rect.top() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.bottom() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
    }
}